

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_wrapper.cc
# Opt level: O2

Int __thiscall
ipx::BasicLu::_Factorize
          (BasicLu *this,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,bool strict_abs_pivottol)

{
  double d;
  double d_00;
  pointer pdVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  logic_error *this_00;
  double *xstore;
  char *pcVar5;
  undefined7 in_register_00000089;
  Int ncall;
  int c0ntinue;
  bool bVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  string local_90;
  string local_70;
  string local_50;
  
  bVar6 = (int)CONCAT71(in_register_00000089,strict_abs_pivottol) != 0;
  if (bVar6) {
    dVar7 = 1.0;
  }
  else {
    dVar7 = 0.0;
  }
  xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar6) {
    uVar8 = 0xd2f1a9fc;
    uVar9 = 0x3f50624d;
  }
  else {
    uVar8 = 0x86a12b9b;
    uVar9 = 0x3d06849b;
  }
  xstore[0xd] = dVar7;
  xstore[5] = (double)CONCAT44(uVar9,uVar8);
  c0ntinue = 0;
  while( true ) {
    uVar2 = basiclu_factorize((this->istore_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,xstore,
                              (this->Li_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Lx_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->Ui_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Ux_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (this->Wi_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (this->Wx_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,Bbegin,Bend,Bi,Bx,c0ntinue);
    if (uVar2 != 1) break;
    Reallocate(this);
    c0ntinue = c0ntinue + 1;
    xstore = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  if ((uVar2 & 0xfffffffd) == 0) {
    pdVar1 = (this->xstore_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->fill_factor_ =
         (double)((int)pdVar1[0x4d] + (int)pdVar1[0x4c] + (int)pdVar1[0x40]) /
         (double)(int)pdVar1[100];
    dVar7 = pdVar1[0x60];
    d = pdVar1[0x61];
    d_00 = pdVar1[0x6f];
    poVar4 = Control::Debug(this->control_,3);
    pcVar5 = " normLinv = ";
    poVar4 = std::operator<<(poVar4," normLinv = ");
    sci2_abi_cxx11_(&local_50,(ipx *)pcVar5,dVar7);
    poVar4 = std::operator<<(poVar4,(string *)&local_50);
    poVar4 = std::operator<<(poVar4,',');
    pcVar5 = " normUinv = ";
    poVar4 = std::operator<<(poVar4," normUinv = ");
    sci2_abi_cxx11_(&local_70,(ipx *)pcVar5,d);
    poVar4 = std::operator<<(poVar4,(string *)&local_70);
    poVar4 = std::operator<<(poVar4,',');
    pcVar5 = " stability = ";
    poVar4 = std::operator<<(poVar4," stability = ");
    sci2_abi_cxx11_(&local_90,(ipx *)pcVar5,d_00);
    poVar4 = std::operator<<(poVar4,(string *)&local_90);
    std::operator<<(poVar4,'\n');
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = (1e-12 < d_00) + 2;
    if (uVar2 != 2) {
      uVar3 = (uint)(1e-12 < d_00);
    }
    return uVar3;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"basiclu_factorize failed");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Int BasicLu::_Factorize(const Int* Bbegin, const Int* Bend, const Int* Bi,
                        const double* Bx, bool strict_abs_pivottol) {
    Int status;
    if (strict_abs_pivottol) {
        xstore_[BASICLU_REMOVE_COLUMNS] = 1;
        xstore_[BASICLU_ABS_PIVOT_TOLERANCE] = kLuDependencyTol;
    } else {
        xstore_[BASICLU_REMOVE_COLUMNS] = 0;
        xstore_[BASICLU_ABS_PIVOT_TOLERANCE] = 1e-14; // BASICLU default
    }
    for (Int ncall = 0; ; ncall++) {
        status = basiclu_factorize(istore_.data(), xstore_.data(),
                                   Li_.data(), Lx_.data(),
                                   Ui_.data(), Ux_.data(),
                                   Wi_.data(), Wx_.data(),
                                   Bbegin, Bend, Bi, Bx, ncall);
        if (status != BASICLU_REALLOCATE)
            break;
        Reallocate();
    }
    if (status != BASICLU_OK && status != BASICLU_WARNING_singular_matrix)
        throw std::logic_error("basiclu_factorize failed");

    Int matrix_nz = xstore_[BASICLU_MATRIX_NZ];
    Int lnz = xstore_[BASICLU_LNZ];
    Int unz = xstore_[BASICLU_UNZ];
    Int dim = xstore_[BASICLU_DIM];
    fill_factor_ = 1.0 * (lnz+unz+dim) / matrix_nz;

    double normLinv = xstore_[BASICLU_NORMEST_LINV];
    double normUinv = xstore_[BASICLU_NORMEST_UINV];
    double stability = xstore_[BASICLU_RESIDUAL_TEST];
    control_.Debug(3)
        << " normLinv = " << sci2(normLinv) << ','
        << " normUinv = " << sci2(normUinv) << ','
        << " stability = " << sci2(stability) << '\n';

    Int ret = 0;
    if (stability > kLuStabilityThreshold)
        ret |= 1;
    if (status == BASICLU_WARNING_singular_matrix)
        ret |= 2;
    return ret;
}